

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_session_ticket(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  undefined8 uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  code *pcVar6;
  long lVar7;
  long *plVar8;
  long *in_RSI;
  long *in_RDI;
  uint uVar9;
  uint uVar10;
  ptls_iovec_t pVar11;
  size_t body_size_2;
  size_t body_size_5;
  size_t body_size_6;
  uint32_t _v_3;
  size_t body_start_6;
  size_t capacity_6;
  uint16_t _v_2;
  size_t body_start_5;
  size_t capacity_5;
  size_t body_size_4;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  uint32_t _v_1;
  uint32_t _v;
  size_t body_start_2;
  size_t capacity_2;
  size_t mess_start_2;
  ptls_key_schedule_t *_key_sched_2;
  ptls_buffer_t *_buf_2;
  ptls_message_emitter_t *_emitter;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t mess_start_1;
  ptls_key_schedule_t *_key_sched_1;
  ptls_buffer_t *_buf_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  size_t orig_off;
  int ret;
  uint32_t ticket_age_add;
  char session_id_smallbuf [128];
  ptls_buffer_t session_id;
  ptls_hash_context_t *msghash_backup;
  void *in_stack_fffffffffffffcf8;
  size_t len;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  ptls_key_schedule_t *in_stack_fffffffffffffd10;
  ptls_key_schedule_t *ppVar12;
  ptls_buffer_t *in_stack_fffffffffffffd18;
  ptls_buffer_t *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  ptls_key_schedule_t *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  uint32_t ticket_age_add_00;
  ptls_buffer_t *in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf1;
  undefined1 in_stack_fffffffffffffdf2;
  undefined1 in_stack_fffffffffffffdf3;
  undefined4 in_stack_fffffffffffffdf4;
  uint8_t *in_stack_fffffffffffffdf8;
  long lVar13;
  size_t in_stack_fffffffffffffe00;
  long lVar14;
  char *in_stack_fffffffffffffe10;
  long lVar15;
  uint16_t in_stack_fffffffffffffe18;
  long lVar16;
  uint16_t in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  size_t local_1d0;
  long local_1c0;
  long local_1a8;
  long local_188;
  long local_138;
  long local_100;
  int local_d0;
  undefined1 local_cc [140];
  void *local_40;
  size_t local_30;
  undefined8 local_20;
  long *local_18;
  long *local_10;
  
  ticket_age_add_00 = (uint32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = (**(code **)(*(long *)(in_RDI[10] + 0x60) + 0x10))(*(undefined8 *)(in_RDI[10] + 0x60));
  if (*(int *)(*local_10 + 0x58) == 0) {
    __assert_fail("tls->ctx->ticket_lifetime != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x590,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  if (*(long *)(*local_10 + 0x78) == 0) {
    __assert_fail("tls->ctx->encrypt_ticket != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x591,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  uVar1 = *(undefined8 *)(*local_18 + 0x10);
  if ((local_10[0x3e] != 0) && ((*(byte *)(*local_10 + 0x70) >> 4 & 1) == 0)) {
    if ((int)local_10[1] != 0xc) {
      __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x596,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    plVar2 = (long *)*local_18;
    lVar3 = local_10[10];
    local_d0 = ptls_buffer__do_pushv
                         ((ptls_buffer_t *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          (void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                          (size_t)in_stack_fffffffffffffcf8);
    if (local_d0 != 0) goto LAB_0012ab9d;
    local_100 = 3;
    local_d0 = ptls_buffer__do_pushv
                         ((ptls_buffer_t *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          (void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                          (size_t)in_stack_fffffffffffffcf8);
    if (local_d0 != 0) goto LAB_0012ab9d;
    lVar4 = plVar2[2];
    lVar16 = plVar2[2];
    for (; local_100 != 0; local_100 = local_100 + -1) {
      *(char *)(*plVar2 + (lVar4 - local_100)) =
           (char)((ulong)(lVar16 - lVar4) >> (((char)local_100 + -1) * '\b' & 0x3fU));
    }
    if (lVar3 != 0) {
      ptls__key_schedule_update_hash
                (in_stack_fffffffffffffd10,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    }
    *(undefined8 *)(*local_18 + 0x10) = uVar1;
  }
  plVar2 = (long *)*local_18;
  lVar3 = local_10[10];
  local_d0 = ptls_buffer__do_pushv
                       ((ptls_buffer_t *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        (void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (size_t)in_stack_fffffffffffffcf8);
  if (local_d0 == 0) {
    local_138 = 3;
    local_d0 = ptls_buffer__do_pushv
                         ((ptls_buffer_t *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          (void *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                          (size_t)in_stack_fffffffffffffcf8);
    if (local_d0 == 0) {
      lVar4 = plVar2[2];
      local_d0 = ptls_buffer_reserve((ptls_buffer_t *)
                                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      if (local_d0 == 0) {
        if (local_10[0x3e] == 0) {
          ppVar12 = (ptls_key_schedule_t *)(local_10 + 0xb);
        }
        else {
          ppVar12 = (ptls_key_schedule_t *)local_10[0x3e];
        }
        local_d0 = calc_verify_data((void *)(*(long *)*local_18 + *(long *)(*local_18 + 0x10)),
                                    ppVar12,(void *)CONCAT44(in_stack_fffffffffffffd9c,
                                                             in_stack_fffffffffffffd98));
        if (local_d0 == 0) {
          *(long *)(*local_18 + 0x10) =
               *(long *)(*(long *)(local_10[10] + 0x58) + 8) + *(long *)(*local_18 + 0x10);
          lVar16 = plVar2[2];
          for (; local_138 != 0; local_138 = local_138 + -1) {
            *(char *)(*plVar2 + (lVar4 - local_138)) =
                 (char)((ulong)(lVar16 - lVar4) >> (((char)local_138 + -1) * '\b' & 0x3fU));
          }
          if (lVar3 != 0) {
            ptls__key_schedule_update_hash
                      (in_stack_fffffffffffffd10,
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          }
          *(undefined8 *)(*local_18 + 0x10) = uVar1;
          (**(code **)*local_10)(local_cc,4);
          ptls_buffer_init((ptls_buffer_t *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           in_stack_fffffffffffffcf8,0x12a099);
          ptls_iovec_init((void *)0x0,0);
          len = local_10[0x21];
          ppVar12 = (ptls_key_schedule_t *)local_10[0x22];
          uVar10 = (uint)*(ushort *)local_10[0x23];
          uVar9 = (uint)*(ushort *)local_10[0x24];
          pVar11.len = in_stack_fffffffffffffe00;
          pVar11.base = in_stack_fffffffffffffdf8;
          local_d0 = encode_session_identifier
                               ((ptls_context_t *)
                                CONCAT44(in_stack_fffffffffffffdf4,
                                         CONCAT13(in_stack_fffffffffffffdf3,
                                                  CONCAT12(in_stack_fffffffffffffdf2,
                                                           CONCAT11(in_stack_fffffffffffffdf1,
                                                                    in_stack_fffffffffffffdf0)))),
                                in_stack_fffffffffffffde8,ticket_age_add_00,pVar11,
                                in_stack_fffffffffffffdd8,in_stack_fffffffffffffe10,
                                in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
                                in_stack_fffffffffffffe28);
          plVar2 = local_18;
          if ((local_d0 == 0) && (local_d0 = (*(code *)local_18[3])(local_18), local_d0 == 0)) {
            plVar5 = (long *)*plVar2;
            lVar3 = local_10[10];
            local_d0 = ptls_buffer__do_pushv
                                 ((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                  (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len);
            if (local_d0 == 0) {
              local_188 = 3;
              local_d0 = ptls_buffer__do_pushv
                                   ((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                    (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len);
              if (local_d0 == 0) {
                lVar4 = plVar5[2];
                local_d0 = ptls_buffer__do_pushv
                                     ((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                      (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len);
                if ((local_d0 == 0) &&
                   (local_d0 = ptls_buffer__do_pushv
                                         ((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9)
                                          ,(void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len),
                   local_d0 == 0)) {
                  local_1a8 = 1;
                  local_d0 = ptls_buffer__do_pushv
                                       ((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                        (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len);
                  if (local_d0 == 0) {
                    lVar16 = *(long *)(*local_18 + 0x10);
                    lVar15 = *(long *)(*local_18 + 0x10);
                    for (; local_1a8 != 0; local_1a8 = local_1a8 + -1) {
                      *(char *)(*(long *)*local_18 + (lVar16 - local_1a8)) =
                           (char)((ulong)(lVar15 - lVar16) >>
                                 (((char)local_1a8 + -1) * '\b' & 0x3fU));
                    }
                    local_1c0 = 2;
                    local_d0 = ptls_buffer__do_pushv
                                         ((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9)
                                          ,(void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len);
                    plVar8 = local_10;
                    if (local_d0 == 0) {
                      lVar16 = *(long *)(*local_18 + 0x10);
                      pcVar6 = (code *)**(undefined8 **)(*local_10 + 0x78);
                      uVar1 = *(undefined8 *)(*local_10 + 0x78);
                      lVar15 = *local_18;
                      pVar11 = ptls_iovec_init(local_40,local_30);
                      local_1d0 = pVar11.len;
                      local_d0 = (*pcVar6)(uVar1,plVar8,1,lVar15,pVar11.base,local_1d0);
                      if (local_d0 == 0) {
                        lVar15 = *(long *)(*local_18 + 0x10);
                        for (; local_1c0 != 0; local_1c0 = local_1c0 + -1) {
                          *(char *)(*(long *)*local_18 + (lVar16 - local_1c0)) =
                               (char)((ulong)(lVar15 - lVar16) >>
                                     (((char)local_1c0 + -1) * '\b' & 0x3fU));
                        }
                        lVar16 = 2;
                        local_d0 = ptls_buffer__do_pushv
                                             ((ptls_buffer_t *)
                                              CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                              (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10),len
                                             );
                        if (local_d0 == 0) {
                          lVar15 = *(long *)(*local_18 + 0x10);
                          if (*(int *)(*local_10 + 0x5c) != 0) {
                            local_d0 = ptls_buffer__do_pushv
                                                 ((ptls_buffer_t *)
                                                  CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                                  (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10)
                                                  ,len);
                            if (local_d0 != 0) goto LAB_0012ab9d;
                            lVar14 = 2;
                            in_stack_fffffffffffffd20 = (ptls_buffer_t *)0x2;
                            local_d0 = ptls_buffer__do_pushv
                                                 ((ptls_buffer_t *)
                                                  CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                                  (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10)
                                                  ,len);
                            if (local_d0 != 0) goto LAB_0012ab9d;
                            lVar13 = *(long *)(*local_18 + 0x10);
                            local_d0 = ptls_buffer__do_pushv
                                                 ((ptls_buffer_t *)
                                                  CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                                  (void *)CONCAT44(in_stack_fffffffffffffd04,uVar10)
                                                  ,len);
                            if (local_d0 != 0) goto LAB_0012ab9d;
                            lVar7 = *(long *)(*local_18 + 0x10);
                            if (lVar14 == -1) {
                              local_d0 = ptls_buffer__adjust_quic_blocksize
                                                   (in_stack_fffffffffffffd18,(size_t)ppVar12);
                              if (local_d0 != 0) goto LAB_0012ab9d;
                            }
                            else {
                              for (; lVar14 != 0; lVar14 = lVar14 + -1) {
                                *(char *)(*(long *)*local_18 + (lVar13 - lVar14)) =
                                     (char)((ulong)(lVar7 - lVar13) >>
                                           (((char)lVar14 + -1) * '\b' & 0x3fU));
                              }
                            }
                          }
                          lVar14 = *(long *)(*local_18 + 0x10);
                          if (lVar16 == -1) {
                            local_d0 = ptls_buffer__adjust_quic_blocksize
                                                 (in_stack_fffffffffffffd18,(size_t)ppVar12);
                            if (local_d0 != 0) goto LAB_0012ab9d;
                          }
                          else {
                            for (; lVar16 != 0; lVar16 = lVar16 + -1) {
                              *(char *)(*(long *)*local_18 + (lVar15 - lVar16)) =
                                   (char)((ulong)(lVar14 - lVar15) >>
                                         (((char)lVar16 + -1) * '\b' & 0x3fU));
                            }
                          }
                          lVar16 = plVar5[2];
                          for (; local_188 != 0; local_188 = local_188 + -1) {
                            *(char *)(*plVar5 + (lVar4 - local_188)) =
                                 (char)((ulong)(lVar16 - lVar4) >>
                                       (((char)local_188 + -1) * '\b' & 0x3fU));
                          }
                          if (lVar3 != 0) {
                            ptls__key_schedule_update_hash
                                      (ppVar12,(uint8_t *)CONCAT44(in_stack_fffffffffffffd0c,uVar9),
                                       CONCAT44(in_stack_fffffffffffffd04,uVar10));
                          }
                          local_d0 = (*(code *)plVar2[4])(plVar2);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012ab9d:
  ptls_buffer_dispose(in_stack_fffffffffffffd20);
  (**(code **)(*(long *)(local_10[10] + 0x60) + 8))(*(undefined8 *)(local_10[10] + 0x60),0,0);
  *(undefined8 *)(local_10[10] + 0x60) = local_20;
  return local_d0;
}

Assistant:

static int send_session_ticket(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    ptls_hash_context_t *msghash_backup = tls->key_schedule->hashes[0].ctx->clone_(tls->key_schedule->hashes[0].ctx);
    ptls_buffer_t session_id;
    char session_id_smallbuf[128];
    uint32_t ticket_age_add;
    int ret = 0;

    assert(tls->ctx->ticket_lifetime != 0);
    assert(tls->ctx->encrypt_ticket != NULL);

    { /* calculate verify-data that will be sent by the client */
        size_t orig_off = emitter->buf->off;
        if (tls->pending_handshake_secret != NULL && !tls->ctx->omit_end_of_early_data) {
            assert(tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);
            ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
            emitter->buf->off = orig_off;
        }
        ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                        tls->pending_handshake_secret != NULL ? tls->pending_handshake_secret
                                                                              : tls->traffic_protection.dec.secret)) != 0)
                goto Exit;
            emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
        });
        emitter->buf->off = orig_off;
    }

    tls->ctx->random_bytes(&ticket_age_add, sizeof(ticket_age_add));

    /* build the raw nsk */
    ptls_buffer_init(&session_id, session_id_smallbuf, sizeof(session_id_smallbuf));
    ret = encode_session_identifier(tls->ctx, &session_id, ticket_age_add, ptls_iovec_init(NULL, 0), tls->key_schedule,
                                    tls->server_name, tls->key_share->id, tls->cipher_suite->id, tls->negotiated_protocol);
    if (ret != 0)
        goto Exit;

    /* encrypt and send */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, {
        ptls_buffer_push32(emitter->buf, tls->ctx->ticket_lifetime);
        ptls_buffer_push32(emitter->buf, ticket_age_add);
        ptls_buffer_push_block(emitter->buf, 1, {});
        ptls_buffer_push_block(emitter->buf, 2, {
            if ((ret = tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 1, emitter->buf,
                                                    ptls_iovec_init(session_id.base, session_id.off))) != 0)
                goto Exit;
        });
        ptls_buffer_push_block(emitter->buf, 2, {
            if (tls->ctx->max_early_data_size != 0)
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_EARLY_DATA,
                                      { ptls_buffer_push32(emitter->buf, tls->ctx->max_early_data_size); });
        });
    });

Exit:
    ptls_buffer_dispose(&session_id);

    /* restore handshake state */
    tls->key_schedule->hashes[0].ctx->final(tls->key_schedule->hashes[0].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx = msghash_backup;

    return ret;
}